

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.hpp
# Opt level: O3

void __thiscall duckdb::RegexLocalState::~RegexLocalState(RegexLocalState *this)

{
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__RegexLocalState_01987e68;
  RegexStringPieceArgs::~RegexStringPieceArgs(&this->group_buffer);
  duckdb_re2::RE2::~RE2(&this->constant_pattern);
  FunctionLocalState::~FunctionLocalState(&this->super_FunctionLocalState);
  operator_delete(this);
  return;
}

Assistant:

explicit RegexLocalState(RegexpBaseBindData &info, bool extract_all = false)
	    : constant_pattern(duckdb_re2::StringPiece(info.constant_string.c_str(), info.constant_string.size()),
	                       info.options) {
		if (!constant_pattern.ok()) {
			throw InvalidInputException(constant_pattern.error());
		}
		if (extract_all) {
			auto group_count_p = constant_pattern.NumberOfCapturingGroups();
			if (group_count_p != -1) {
				group_buffer.Init(NumericCast<idx_t>(group_count_p));
			}
		}
		D_ASSERT(info.constant_pattern);
	}